

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer pbVar1;
  pointer puVar2;
  pointer pvVar3;
  ostream *poVar4;
  socklen_t sVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_00;
  long lVar6;
  undefined8 *puVar7;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  *pGVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *i;
  pointer pvVar9;
  unsigned_long *j_1;
  pointer puVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *j;
  pointer pbVar11;
  pointer pvVar12;
  byte bVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<unsigned_long> __l_00;
  allocator<char> local_21a;
  allocator<char> local_219;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  scc_1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  scc;
  undefined1 local_1d1 [2];
  allocator<char> local_1cf;
  allocator<char> local_1ce;
  allocator<char> local_1cd;
  allocator<char> local_1cc;
  allocator<char> local_1cb;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodes;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  graph;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  bVar13 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&graph,"A",(allocator<char> *)&scc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&graph.nodes._M_h._M_rehash_policy,"B",(allocator<char> *)&scc_1);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"C",&local_219);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"D",&local_21a);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"E",&local_1c9);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"F",&local_1ca);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"G",&local_1cb);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"H",&local_1cc);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"I",&local_1cd);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"J",&local_1ce);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"K",&local_1cf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"L",(allocator<char> *)(local_1d1 + 1));
  end._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d1;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&graph;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&nodes,__l,(allocator_type *)end._M_current);
  lVar6 = 0x160;
  do {
    std::__cxx11::string::~string((string *)((long)&graph.nodes._M_h._M_buckets + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  ::scc::AssocMapType<std::__cxx11::string,Graph<std::__cxx11::string,scc::AssocMapType>::Node>::
  construct<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&graph.nodes,
             (AssocMapType<std::__cxx11::string,Graph<std::__cxx11::string,scc::AssocMapType>::Node>
              *)nodes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )nodes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,end);
  sVar5 = (socklen_t)end._M_current;
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"A",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"B",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"B",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"D",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"B",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"E",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"B",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"C",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"C",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"F",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"E",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"B",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"E",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"F",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"E",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"G",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"F",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"C",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"F",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"H",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"G",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"H",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"G",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"J",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"H",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"K",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"I",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"G",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"J",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"I",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"K",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"L",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc,"L",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&scc_1,"J",&local_21a);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect(&graph,(int)&scc,(sockaddr *)&scc_1,sVar5);
  std::__cxx11::string::~string((string *)&scc_1);
  std::__cxx11::string::~string((string *)&scc);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::scc(&scc,&graph);
  pvVar3 = scc.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar9 = scc.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar3; pvVar9 = pvVar9 + 1) {
    pbVar1 = (pvVar9->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar11 = (pvVar9->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1;
        pbVar11 = pbVar11 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)pbVar11);
      std::operator<<(poVar4," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&scc);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&nodes);
  puVar7 = &DAT_001050b0;
  pGVar8 = &graph;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pGVar8->nodes)._M_h._M_buckets = (__buckets_ptr)*puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    pGVar8 = (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
              *)((long)pGVar8 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  end_00._M_current = (unsigned_long *)&scc_1;
  __l_00._M_len = 0xd;
  __l_00._M_array = (iterator)&graph;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&scc,__l_00,
             (allocator_type *)end_00._M_current);
  ::scc::VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node>::
  construct<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Container *)&graph,
             (VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node> *)
             scc.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )scc.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,end_00);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  sVar5 = (socklen_t)end_00._M_current;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xa;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x9;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xa;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x9;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_0000000c;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_0000000c;
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xa;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)&graph,(int)&scc_1,(sockaddr *)&nodes,sVar5);
  Graph<unsigned_long,_scc::VectorType>::scc(&scc_1,(Graph<unsigned_long,_scc::VectorType> *)&graph)
  ;
  for (pvVar12 = scc_1.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pvVar12 !=
      scc_1.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pvVar12 = pvVar12 + 1) {
    puVar2 = (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar10 = (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2;
        puVar10 = puVar10 + 1) {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar4," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&scc_1);
  std::
  vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
  ::~vector((vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
             *)&graph);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&scc);
  return 0;
}

Assistant:

int main() {
    using namespace scc;
    {
        std::vector<std::string> nodes{
                "A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L"
        };
        Graph<std::string, AssocMapType> graph{nodes.begin(), nodes.end()};
        graph.connect("A", "B");
        graph.connect("B", "D");
        graph.connect("B", "E");
        graph.connect("B", "C");
        graph.connect("C", "F");
        graph.connect("E", "B");
        graph.connect("E", "F");
        graph.connect("E", "G");
        graph.connect("F", "C");
        graph.connect("F", "H");
        graph.connect("G", "H");
        graph.connect("G", "J");
        graph.connect("H", "K");
        graph.connect("I", "G");
        graph.connect("J", "I");
        graph.connect("K", "L");
        graph.connect("L", "J");
        auto scc = graph.scc();
        for (auto &i: scc) {
            for (auto &j: i) {
                std::cout << j << " ";
            }
            std::cout << std::endl;
        }
    }

    {
        std::vector<size_t> nodes{
               0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12
        };
        Graph<size_t , VectorType> graph{nodes.begin(), nodes.end()};
        graph.connect(1, 2);
        graph.connect(2, 4);
        graph.connect(2, 5);
        graph.connect(2, 3);
        graph.connect(3, 6);
        graph.connect(5, 2);
        graph.connect(5, 6);
        graph.connect(5, 7);
        graph.connect(6, 3);
        graph.connect(6, 8);
        graph.connect(7, 8);
        graph.connect(7, 10);
        graph.connect(8, 11);
        graph.connect(9, 7);
        graph.connect(10, 9);
        graph.connect(11, 12);
        graph.connect(12, 10);
        auto scc = graph.scc();
        for (auto &i: scc) {
            for (auto &j: i) {
                std::cout << j << " ";
            }
            std::cout << std::endl;
        }
    }
    return 0;
}